

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Jinx.hpp
# Opt level: O2

bool __thiscall Jinx::Impl::Parser::ParseStatement(Parser *this)

{
  pointer pFVar1;
  pointer pFVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  VisibilityType scope;
  uint32_t uVar6;
  RuntimeID val;
  mapped_type *this_00;
  size_t sVar7;
  size_t address;
  Opcode opcode;
  char *pcVar8;
  byte bVar9;
  byte bVar10;
  initializer_list<Jinx::Impl::SymbolType> symbols;
  char *local_b0;
  PropertyName propertyName;
  FunctionMatch functionMatch;
  
  if (this->m_error != false) {
    return false;
  }
  CheckFunctionCall(&functionMatch,this);
  if (functionMatch.signature != (FunctionSignature *)0x0) {
    ParseFunctionCall(this,&functionMatch);
    EmitOpcode(this,Pop);
    bVar3 = false;
    Expect(this,NewLine,(char *)0x0);
    goto LAB_001cbd0a;
  }
  bVar3 = Accept(this,Set);
  scope = ParseScope(this);
  bVar4 = Accept(this,Readonly);
  if (bVar4 && scope == Local) {
    pcVar8 = "The \'readonly\' keyword must follow a private or public keyword";
LAB_001cbc63:
    Error<>(this,pcVar8);
LAB_001cbc6b:
    bVar9 = 0;
LAB_001cbd04:
    bVar10 = 0;
  }
  else {
    opcode = Return;
    bVar5 = Accept(this,Function);
    if (bVar5) {
      ParseFunctionDefinition(this,scope);
LAB_001cbd01:
      bVar9 = 1;
      goto LAB_001cbd04;
    }
    if ((bVar3) && (bVar3 = CheckName(this), bVar3)) {
      bVar3 = std::operator==(&((this->m_currentSymbol)._M_current)->text,
                              &((this->m_library).
                                super___shared_ptr<Jinx::Impl::Library,_(__gnu_cxx::_Lock_policy)2>.
                               _M_ptr)->m_name);
      if (bVar3) {
        pcVar8 = "Illegal use of library name in identifier";
        goto LAB_001cbc63;
      }
      if (scope == Local) {
        bVar3 = CheckProperty(this,(size_t *)0x0);
        if (bVar3) {
          ParsePropertyName(&propertyName,this);
          if (propertyName.m_readOnly == true) {
            Error<>(this,"Can\'t change readonly property");
          }
          else {
            uVar6 = ParseSubscriptSet(this);
            Expect(this,To,(char *)0x0);
            ParseExpression(this);
            Expect(this,NewLine,(char *)0x0);
            if (uVar6 == 0) {
              EmitOpcode(this,SetProp);
            }
            else {
              EmitOpcode(this,SetPropKeyVal);
              BinaryWriter::Write(&this->m_writer,uVar6);
            }
            BinaryWriter::Write(&this->m_writer,propertyName.m_id);
            local_b0 = (char *)propertyName.m_id;
            this_00 = std::
                      map<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_std::less<unsigned_long>,_Jinx::StaticAllocator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_>,_8192UL,_16UL>_>
                      ::operator[](&this->m_idNameMap,(key_type_conflict *)&local_b0);
            std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::
            _M_assign(this_00,&propertyName.m_name);
          }
          PropertyName::~PropertyName(&propertyName);
          bVar9 = propertyName.m_readOnly ^ 1;
          goto LAB_001cbd04;
        }
        local_b0 = (char *)0x140000003f;
        symbols._M_len = 2;
        symbols._M_array = (iterator)&local_b0;
        ParseMultiName_abi_cxx11_((String *)&propertyName,this,symbols);
        uVar6 = ParseSubscriptSet(this);
        Expect(this,To,(char *)0x0);
        ParseExpression(this);
        Expect(this,NewLine,"Unable to parse expression");
        VariableAssign(this,(String *)&propertyName);
        if (uVar6 == 0) {
          EmitOpcode(this,SetVar);
        }
        else {
          EmitOpcode(this,SetVarKeyVal);
          BinaryWriter::Write(&this->m_writer,uVar6);
        }
        val = VariableNameToRuntimeID(this,(String *)&propertyName);
        BinaryWriter::Write(&this->m_writer,val);
LAB_001cbf4d:
        std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::
        ~basic_string((basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_> *)
                      &propertyName);
      }
      else {
        ParsePropertyDeclaration(this,scope,bVar4);
      }
      goto LAB_001cbd01;
    }
    if (scope != Local) {
      pcVar8 = "private";
      if (scope == Public) {
        pcVar8 = "public";
      }
      propertyName.m_id = (RuntimeID)pcVar8;
      Error<char_const*>(this,"Invalid symbol after scope specifier \'%s\'",(char **)&propertyName);
      goto LAB_001cbd01;
    }
    bVar3 = Accept(this,Begin);
    if (!bVar3) {
      bVar3 = Accept(this,If);
      if (bVar3) {
        ParseIfElse(this);
      }
      else {
        bVar3 = Accept(this,Loop);
        if (bVar3) {
          ParseLoop(this);
        }
        else {
          bVar3 = Accept(this,Erase);
          if (bVar3) {
            ParseErase(this);
          }
          else {
            bVar3 = Check(this,Increment);
            if ((bVar3) || (bVar3 = Check(this,Decrement), bVar3)) {
              ParseIncDec(this);
            }
            else {
              bVar3 = Accept(this,Return);
              if (bVar3) {
                pFVar1 = (this->m_variableStackFrame).m_frames.
                         super__Vector_base<Jinx::Impl::VariableStackFrame::FrameData,_Jinx::StaticAllocator<Jinx::Impl::VariableStackFrame::FrameData,_2048UL,_16UL>_>
                         ._M_impl.super__Vector_impl_data._M_finish;
                pFVar2 = (this->m_variableStackFrame).m_frames.
                         super__Vector_base<Jinx::Impl::VariableStackFrame::FrameData,_Jinx::StaticAllocator<Jinx::Impl::VariableStackFrame::FrameData,_2048UL,_16UL>_>
                         ._M_impl.super__Vector_impl_data._M_start;
                bVar3 = Check(this,NewLine);
                if ((long)pFVar1 - (long)pFVar2 == 0x20) {
                  opcode = Exit;
                  if (!bVar3) {
                    LogWriteLine(Warning,"Return values at root scope do nothing");
                    ParseExpression(this);
                  }
                }
                else if (bVar3) {
                  EmitOpcode(this,PushVal);
                  propertyName.m_id = propertyName.m_id & 0xffffffff00000000;
                  Jinx::Variant::SetNull((Variant *)&propertyName);
                  Jinx::Variant::Write((Variant *)&propertyName,&this->m_writer);
                  Jinx::Variant::Destroy((Variant *)&propertyName);
                }
                else {
                  ParseExpression(this);
                }
                EmitOpcode(this,opcode);
                bVar9 = 1;
                Accept(this,NewLine);
                bVar10 = 1;
                goto LAB_001cbd07;
              }
              bVar3 = Accept(this,Break);
              if (bVar3) {
                Expect(this,NewLine,(char *)0x0);
                EmitOpcode(this,Jump);
                sVar7 = EmitAddressPlaceholder(this);
                this->m_breakAddress = sVar7;
              }
              else {
                bVar3 = Accept(this,Wait);
                if (bVar3) {
                  bVar3 = Accept(this,NewLine);
                  if (bVar3) {
                    EmitOpcode(this,Wait);
                  }
                  else {
                    bVar3 = Check(this,Until);
                    if ((!bVar3) && (bVar3 = Check(this,While), !bVar3)) {
                      pcVar8 = "Unexpected symbol after wait";
                      goto LAB_001cc228;
                    }
                    sVar7 = (this->m_writer).m_pos;
                    bVar3 = Accept(this,Until);
                    if (!bVar3) {
                      Expect(this,While,(char *)0x0);
                    }
                    ParseExpression(this);
                    bVar4 = Expect(this,NewLine,(char *)0x0);
                    if (!bVar4) goto LAB_001cbc6b;
                    EmitOpcode(this,(uint)bVar3 * 2 + JumpFalse);
                    address = EmitAddressPlaceholder(this);
                    EmitOpcode(this,Wait);
                    EmitOpcode(this,Jump);
                    BinaryWriter::Write(&this->m_writer,(uint32_t)sVar7);
                    EmitAddressBackfill(this,address);
                  }
                }
                else {
                  bVar3 = Accept(this,External);
                  if (bVar3) {
                    bVar3 = CheckProperty(this,(size_t *)0x0);
                    ParseMultiName_abi_cxx11_
                              ((String *)&propertyName,this,
                               (initializer_list<Jinx::Impl::SymbolType>)ZEXT816(0));
                    pFVar1 = (this->m_variableStackFrame).m_frames.
                             super__Vector_base<Jinx::Impl::VariableStackFrame::FrameData,_Jinx::StaticAllocator<Jinx::Impl::VariableStackFrame::FrameData,_2048UL,_16UL>_>
                             ._M_impl.super__Vector_impl_data._M_finish;
                    if ((long)pFVar1 -
                        (long)(this->m_variableStackFrame).m_frames.
                              super__Vector_base<Jinx::Impl::VariableStackFrame::FrameData,_Jinx::StaticAllocator<Jinx::Impl::VariableStackFrame::FrameData,_2048UL,_16UL>_>
                              ._M_impl.super__Vector_impl_data._M_start == 0x20) {
                      if ((long)pFVar1[-1].stack.
                                super__Vector_base<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_>,_Jinx::Allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_>_>,_Jinx::Allocator<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_>,_Jinx::Allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                          (long)pFVar1[-1].stack.
                                super__Vector_base<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_>,_Jinx::Allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_>_>,_Jinx::Allocator<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_>,_Jinx::Allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start == 0x30) {
                        if (bVar3) {
                          local_b0 = (char *)propertyName.m_id;
                          Error<char_const*>(this,
                                             "External variable \'%s\' is already a property name",
                                             &local_b0);
                        }
                        else {
                          bVar3 = VariableStackFrame::VariableExists
                                            (&this->m_variableStackFrame,(String *)&propertyName);
                          if (bVar3) {
                            local_b0 = (char *)propertyName.m_id;
                            Error<char_const*>(this,"Variable \'%s\' already exists",&local_b0);
                          }
                          else {
                            bVar3 = VariableStackFrame::VariableAssign
                                              (&this->m_variableStackFrame,(String *)&propertyName);
                            if (!bVar3) {
                              local_b0 = (char *)propertyName.m_id;
                              Error<char_const*>(this,"Error creating external variable \'%s\'",
                                                 &local_b0);
                            }
                          }
                        }
                      }
                      else {
                        local_b0 = (char *)propertyName.m_id;
                        Error<char_const*>(this,
                                           "External variable \'%s\' must be declared at the root scope"
                                           ,&local_b0);
                      }
                    }
                    else {
                      local_b0 = (char *)propertyName.m_id;
                      Error<char_const*>(this,
                                         "External variable \'%s\' can\'t be declared in a function"
                                         ,&local_b0);
                    }
                    Expect(this,NewLine,(char *)0x0);
                    goto LAB_001cbf4d;
                  }
                  pcVar8 = "Unknown symbol in statement";
LAB_001cc228:
                  Error<>(this,pcVar8);
                }
              }
            }
          }
        }
      }
      goto LAB_001cbd01;
    }
    Expect(this,NewLine,(char *)0x0);
    ParseBlock(this);
    Expect(this,End,(char *)0x0);
    bVar10 = 0;
    Expect(this,NewLine,(char *)0x0);
    bVar9 = 1;
  }
LAB_001cbd07:
  bVar3 = (bool)(bVar9 & bVar10);
LAB_001cbd0a:
  std::
  _Vector_base<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>,_Jinx::Allocator<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>_>_>
  ::~_Vector_base(&functionMatch.partData.
                   super__Vector_base<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>,_Jinx::Allocator<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>_>_>
                 );
  return bVar3;
}

Assistant:

inline bool Parser::ParseStatement()
	{
		// No need to continue if an error has been flagged
		if (m_error)
			return false;

		bool returnedValue = false;

		// Functions signatures have precedence over everything, so check for a 
		// potential signature match before anything else.
		const auto functionMatch = CheckFunctionCall();
		if (functionMatch.signature)
		{
			// We found a valid function signature that matches the current token(s)
			ParseFunctionCall(functionMatch);

			// Since all functions return a value, we need to discard the return
			// value not on the stack, since we're not assigning it to a variable.
			EmitOpcode(Opcode::Pop);
			Expect(SymbolType::NewLine);
		}
		else
		{
			bool set = Accept(SymbolType::Set);

			// Parse scope level
			VisibilityType scope = ParseScope();

			// Parse optional readonly, which can only apply to properties
			bool readOnly = Accept(SymbolType::Readonly);
			if (readOnly)
			{
				if (scope == VisibilityType::Local)
				{
					Error("The 'readonly' keyword must follow a private or public keyword");
					return false;
				}
			}

			if (Accept(SymbolType::Function))
			{
				// We're parsing a function definition
				ParseFunctionDefinition(scope);
			}
			else if (set && CheckName())
			{
				// Can't use the current library name or preface the variable with it
				if (m_currentSymbol->text == m_library->GetName())
				{
					Error("Illegal use of library name in identifier");
					return false;
				}

				// We're declaring a new property if we see a non-local scope declaration
				if (scope != VisibilityType::Local)
				{
					ParsePropertyDeclaration(scope, readOnly);
				}
				// Either this is an existing property or a variable
				else
				{
					// Check to see if this is an existing property
					if (CheckProperty())
					{
						// Get the property name
						auto propertyName = ParsePropertyName();

						// Make sure we're not trying to assign a value to a readonly property
						if (propertyName.IsReadOnly())
						{
							Error("Can't change readonly property");
							return false;
						}

						// Check for subscript operators
						uint32_t subscripts = ParseSubscriptSet();

						// Check for a 'to' statement
						Expect(SymbolType::To);

						// Parse expression
						ParseExpression();
						Expect(SymbolType::NewLine);

						// Assign property
						if (subscripts)
						{
							EmitOpcode(Opcode::SetPropKeyVal);
							EmitCount(subscripts);
						}
						else
							EmitOpcode(Opcode::SetProp);

						EmitId(propertyName.GetId());
						m_idNameMap[propertyName.GetId()] = propertyName.GetName();
					}
					// Otherwise we're just dealing with an ordinary variable
					else
					{
						// Get the variable name
						String name = ParseMultiName({ SymbolType::To, SymbolType::SquareOpen });

						// Check for subscript operator
						uint32_t subscripts = ParseSubscriptSet();

						// Check for a 'to' statement
						Expect(SymbolType::To);

						// Parse expression
						ParseExpression();
						Expect(SymbolType::NewLine, "Unable to parse expression");

						// Add to variable table
						VariableAssign(name);

						// Assign a variable. 
						if (subscripts)
						{
							EmitOpcode(Opcode::SetVarKeyVal);
							EmitCount(subscripts);
						}
						else
							EmitOpcode(Opcode::SetVar);
						EmitId(VariableNameToRuntimeID(name));
					}
				}
			}
			else if (scope == VisibilityType::Local)
			{
				if (Accept(SymbolType::Begin))
				{
					// We're parsing a begin/end block
					Expect(SymbolType::NewLine);
					ParseBlock();
					Expect(SymbolType::End);
					Expect(SymbolType::NewLine);
				}
				else if (Accept(SymbolType::If))
				{
					// We're parsing an if or if/else block
					ParseIfElse();
				}
				else if (Accept(SymbolType::Loop))
				{
					// We're parsing a loop block
					ParseLoop();
				}
				else if (Accept(SymbolType::Erase))
				{
					// We're parsing an erase operation
					ParseErase();
				}
				else if (Check(SymbolType::Increment) || Check(SymbolType::Decrement))
				{
					// We're parsing an increment or decrement statement
					ParseIncDec();
				}
				else if (Accept(SymbolType::Return))
				{
					// We've hit a return value.  There are different behaviors depending whether or
					// not we're at the base scope or not.
					if (m_variableStackFrame.IsRootFrame())
					{
						if (!Check(SymbolType::NewLine))
						{
							LogWriteLine(LogLevel::Warning, "Return values at root scope do nothing");
							ParseExpression();
						}
						EmitOpcode(Opcode::Exit);
						Accept(SymbolType::NewLine);
						returnedValue = true;
					}
					else
					{
						if (!Check(SymbolType::NewLine))
						{
							ParseExpression();
						}
						else
						{
							EmitOpcode(Opcode::PushVal);
							EmitValue(nullptr);
						}
						EmitOpcode(Opcode::Return);
						Accept(SymbolType::NewLine);
						returnedValue = true;
					}
				}
				else if (Accept(SymbolType::Break))
				{
					// We've hit a break statement
					Expect(SymbolType::NewLine);
					EmitOpcode(Opcode::Jump);
					m_breakAddress = EmitAddressPlaceholder();
				}
				else if (Accept(SymbolType::Wait))
				{
					// Check for basic wait statement
					if (Accept(SymbolType::NewLine))
						EmitOpcode(Opcode::Wait);
					else if (Check(SymbolType::Until) || Check(SymbolType::While))
					{
						// Store expression address
						auto expressionAddress = m_writer.Tell();

						// Check which keyword was used
						bool jumpTrue = Accept(SymbolType::Until);
						if (!jumpTrue)
							Expect(SymbolType::While);

						// Parse the expression to check for wait
						ParseExpression();
						if (!Expect(SymbolType::NewLine))
							return false;

						// Add jump if false/true over wait statement depending on keyword
						EmitOpcode(jumpTrue ? Opcode::JumpTrue : Opcode::JumpFalse);

						// Mark placeholder for later jump address insertion
						auto addressPlaceholder = EmitAddressPlaceholder();

						// Wait statement is executed if expression is true
						EmitOpcode(Opcode::Wait);
						EmitOpcode(Opcode::Jump);
						EmitAddress(expressionAddress);

						// Backfill placeholder at end of conditional wait statement
						EmitAddressBackfill(addressPlaceholder);
					}
					else
					{
						Error("Unexpected symbol after wait");
					}
				}
				else if (Accept(SymbolType::External))
				{
					// First check to see if this collides with an existing property name
					bool propExists = CheckProperty();

					// Get the variable name
					String name = ParseMultiName({ });

					// Validate the name is legal and register it as a variable name
					if (!m_variableStackFrame.IsRootFrame())
						Error("External variable '%s' can't be declared in a function", name.c_str());
					else if (!m_variableStackFrame.IsRootScope())
						Error("External variable '%s' must be declared at the root scope", name.c_str());
					else if (propExists)
						Error("External variable '%s' is already a property name", name.c_str());
					else if (m_variableStackFrame.VariableExists(name))
						Error("Variable '%s' already exists", name.c_str());
					else if (!m_variableStackFrame.VariableAssign(name))
						Error("Error creating external variable '%s'", name.c_str());

					Expect(SymbolType::NewLine);
				}
				else
				{
					Error("Unknown symbol in statement");
				}
			}
			else
			{
				Error("Invalid symbol after scope specifier '%s'", scope == VisibilityType::Public ? "public" : "private");
			}
		}

		// This is not an error value, but signals whether we've returned a value from this statement
		return returnedValue;
	}